

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::toHueRainbow(Image *__return_storage_ptr__,Image *_in)

{
  int iVar1;
  ostream *this;
  size_t _index;
  undefined4 extraout_var;
  Image *this_00;
  float _hue;
  vec3 vVar2;
  vec3 local_48 [2];
  int local_2c;
  int local_28;
  int x;
  int y;
  int local_1c;
  int height;
  int width;
  Image *_in_local;
  Image *out;
  
  _height = _in;
  _in_local = __return_storage_ptr__;
  iVar1 = (*_in->_vptr_Image[8])();
  if (iVar1 < 2) {
    local_1c = (*_height->_vptr_Image[6])();
    y = (*_height->_vptr_Image[7])();
    x._3_1_ = 0;
    Image::Image(__return_storage_ptr__,local_1c,y,3);
    for (local_28 = 0; local_28 < y; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
        _index = Image::getIndex(__return_storage_ptr__,(long)local_2c,(long)local_28);
        this_00 = _height;
        iVar1 = (*_height->_vptr_Image[0xe])(_height,(long)local_2c,(long)local_28);
        (*this_00->_vptr_Image[0x18])(this_00,CONCAT44(extraout_var,iVar1));
        vVar2 = hue2rgb((vera *)this_00,_hue);
        local_48[0].field_2 = vVar2.field_2;
        local_48[0]._0_8_ = vVar2._0_8_;
        Image::setColor(__return_storage_ptr__,_index,local_48);
      }
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"The input image have more than one channel");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Image::Image(__return_storage_ptr__,_height);
  }
  return __return_storage_ptr__;
}

Assistant:

Image toHueRainbow(const Image& _in) {
    if (_in.getChannels() > 1) {
        std::cout << "The input image have more than one channel" << std::endl;
        return _in;
    }

    int width = _in.getWidth();
    int height = _in.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++)
        for(int x = 0; x < width; x++)
            out.setColor( out.getIndex(x,y), hue2rgb( _in.getValue(_in.getIndex(x,y)) ) );

    return out;
}